

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O3

void __thiscall
cnn::Node::backward(Node *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
                   ,Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  pointer ppTVar1;
  int iVar2;
  pointer ppTVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs_ptrs;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> xs_elems;
  Tensor fx_elem;
  Tensor dEdxi_elem;
  Tensor dEdf_elem;
  void *local_168;
  iterator iStack_160;
  Tensor **local_158;
  Node *local_148;
  Tensor *local_140;
  Tensor *local_138;
  Tensor *local_130;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_128;
  Tensor *local_108 [6];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_d8;
  Tensor local_c0;
  Tensor local_78;
  
  local_148 = this;
  local_140 = dEdxi;
  local_138 = dEdf;
  iVar2 = (*this->_vptr_Node[7])();
  if ((char)iVar2 == '\0') {
    uVar6 = (fx->d).bd;
    if (uVar6 != 0) {
      if (uVar6 == 1) goto LAB_0016cec5;
      uVar6 = 0;
      local_130 = fx;
      do {
        local_128.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_158 = (Tensor **)0x0;
        local_128.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_168 = (void *)0x0;
        iStack_160._M_current = (Tensor **)0x0;
        ppTVar3 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish != ppTVar3) {
          uVar4 = 0;
          do {
            Tensor::batch_elem((Tensor *)local_108,ppTVar3[uVar4],uVar6);
            std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::emplace_back<cnn::Tensor>
                      (&local_128,(Tensor *)local_108);
            std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_d8);
            ppTVar1 = (xs->
                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish;
            ppTVar3 = (xs->
                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = uVar4 + 1;
          } while (uVar4 < (ulong)((long)ppTVar1 - (long)ppTVar3 >> 3));
          if (ppTVar1 != ppTVar3) {
            lVar5 = 0;
            uVar4 = 0;
            do {
              local_108[0] = (Tensor *)
                             ((long)((local_128.
                                      super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->d).d + lVar5);
              if (iStack_160._M_current == local_158) {
                std::vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>>::
                _M_realloc_insert<cnn::Tensor_const*>
                          ((vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>> *)
                           &local_168,iStack_160,local_108);
              }
              else {
                *iStack_160._M_current = local_108[0];
                iStack_160._M_current = iStack_160._M_current + 1;
              }
              uVar4 = uVar4 + 1;
              lVar5 = lVar5 + 0x48;
            } while (uVar4 < (ulong)((long)(xs->
                                           super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(xs->
                                           super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start >> 3));
          }
        }
        Tensor::batch_elem((Tensor *)local_108,local_130,uVar6);
        Tensor::batch_elem(&local_78,local_138,uVar6);
        Tensor::batch_elem(&local_c0,local_140,uVar6);
        (*local_148->_vptr_Node[6])
                  (local_148,&local_168,(Tensor *)local_108,&local_78,(ulong)i,&local_c0);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_c0.bs);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_78.bs);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_d8);
        if (local_168 != (void *)0x0) {
          operator_delete(local_168);
        }
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_128);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (local_130->d).bd);
    }
    return;
  }
LAB_0016cec5:
  (*local_148->_vptr_Node[6])(local_148,xs,fx,local_138,(ulong)i,local_140);
  return;
}

Assistant:

void Node::backward(const std::vector<const Tensor*>& xs,
                    const Tensor& fx,
                    const Tensor& dEdf,
                    unsigned i,
                    Tensor& dEdxi) const {
  if(this->supports_multibatch() || fx.d.batch_elems() == 1) {
    backward_impl(xs, fx, dEdf, i, dEdxi);
  } else {
    for(unsigned b = 0; b < fx.d.batch_elems(); ++b) {
      std::vector<Tensor>  xs_elems;
      std::vector<const Tensor*> xs_ptrs;
      for(size_t i = 0; i < xs.size(); ++i) xs_elems.push_back(xs[i]->batch_elem(b));
      for(size_t i = 0; i < xs.size(); ++i) xs_ptrs.push_back(&xs_elems[i]);
      Tensor fx_elem(fx.batch_elem(b));
      Tensor dEdf_elem(dEdf.batch_elem(b));
      Tensor dEdxi_elem(dEdxi.batch_elem(b));
      backward_impl(xs_ptrs, fx_elem, dEdf_elem, i, dEdxi_elem);
    }
  }
}